

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O0

void __thiscall
glu::FboRenderContext::createFramebuffer(FboRenderContext *this,RenderConfig *config)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 depthStencilFormat_00;
  undefined4 extraout_var;
  NotSupportedError *pNVar4;
  PixelFormat PVar5;
  int local_130;
  int local_12c;
  RenderTarget local_100;
  undefined1 local_da;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [16];
  int local_a8;
  undefined1 local_a2;
  allocator<char> local_a1;
  int maxSize;
  undefined1 local_7d;
  allocator<char> local_69;
  string local_68;
  int local_48;
  int local_44;
  int stencilBits;
  int depthBits;
  PixelFormat pixelFormat;
  int height;
  int width;
  deUint32 depthStencilFormat;
  deUint32 colorFormat;
  Functions *gl;
  RenderConfig *config_local;
  FboRenderContext *this_local;
  long lVar3;
  
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  dVar2 = chooseColorFormat(config);
  depthStencilFormat_00 = chooseDepthStencilFormat(config);
  pixelFormat.alphaBits = config->width;
  pixelFormat.blueBits = config->height;
  tcu::PixelFormat::PixelFormat((PixelFormat *)&stencilBits);
  local_44 = 0;
  local_48 = 0;
  if ((0 < config->numSamples) && (*(long *)(lVar3 + 0x1240) == 0)) {
    local_7d = 1;
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Multisample FBO is not supported",&local_69);
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_68);
    local_7d = 0;
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (dVar2 == 0) {
    local_a2 = 1;
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxSize,"Unsupported color attachment format",&local_a1);
    tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)&maxSize);
    local_a2 = 0;
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((pixelFormat.alphaBits == -1) || (pixelFormat.blueBits == -1)) {
    local_a8 = 0;
    (**(code **)(lVar3 + 0x868))(0x84e8,&local_a8);
    if (pixelFormat.alphaBits == -1) {
      local_12c = local_a8;
    }
    else {
      local_12c = pixelFormat.alphaBits;
    }
    pixelFormat.alphaBits = local_12c;
    if (pixelFormat.blueBits == -1) {
      local_130 = local_a8;
    }
    else {
      local_130 = pixelFormat.blueBits;
    }
    pixelFormat.blueBits = local_130;
  }
  PVar5 = getPixelFormat(dVar2);
  local_b8._0_8_ = PVar5._0_8_;
  stencilBits = local_b8._0_4_;
  depthBits = local_b8._4_4_;
  local_b8._8_8_ = PVar5._8_8_;
  pixelFormat.redBits = local_b8._8_4_;
  pixelFormat.greenBits = local_b8._12_4_;
  local_b8 = (undefined1  [16])PVar5;
  (**(code **)(lVar3 + 0x6e8))(1,&this->m_colorBuffer);
  (**(code **)(lVar3 + 0xa0))(0x8d41,this->m_colorBuffer);
  if (config->numSamples < 1) {
    (**(code **)(lVar3 + 0x1238))(0x8d41,dVar2,pixelFormat.alphaBits,pixelFormat.blueBits);
  }
  else {
    (**(code **)(lVar3 + 0x1240))
              (0x8d41,config->numSamples,dVar2,pixelFormat.alphaBits,pixelFormat.blueBits);
  }
  (**(code **)(lVar3 + 0xa0))(0x8d41,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  checkError(dVar2,"Creating color renderbuffer",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluFboRenderContext.cpp"
             ,0xfa);
  if (depthStencilFormat_00 != 0) {
    getDepthStencilBits(depthStencilFormat_00,&local_44,&local_48);
    (**(code **)(lVar3 + 0x6e8))(1,&this->m_depthStencilBuffer);
    (**(code **)(lVar3 + 0xa0))(0x8d41,this->m_depthStencilBuffer);
    if (config->numSamples < 1) {
      (**(code **)(lVar3 + 0x1238))
                (0x8d41,depthStencilFormat_00,pixelFormat.alphaBits,pixelFormat.blueBits);
    }
    else {
      (**(code **)(lVar3 + 0x1240))
                (0x8d41,config->numSamples,depthStencilFormat_00,pixelFormat.alphaBits,
                 pixelFormat.blueBits);
    }
    (**(code **)(lVar3 + 0xa0))(0x8d41,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    checkError(dVar2,"Creating depth / stencil renderbuffer",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluFboRenderContext.cpp"
               ,0x10a);
  }
  (**(code **)(lVar3 + 0x6d0))(1,&this->m_framebuffer);
  (**(code **)(lVar3 + 0x78))(0x8d40,this->m_framebuffer);
  if (this->m_colorBuffer != 0) {
    (**(code **)(lVar3 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_colorBuffer);
  }
  if (this->m_depthStencilBuffer != 0) {
    if (0 < local_44) {
      (**(code **)(lVar3 + 0x688))(0x8d40,0x8d00,0x8d41,this->m_depthStencilBuffer);
    }
    if (0 < local_48) {
      (**(code **)(lVar3 + 0x688))(0x8d40,0x8d20,0x8d41,this->m_depthStencilBuffer);
    }
  }
  dVar2 = (**(code **)(lVar3 + 0x800))();
  checkError(dVar2,"Creating framebuffer",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluFboRenderContext.cpp"
             ,0x11c);
  iVar1 = (**(code **)(lVar3 + 0x170))(0x8d40);
  if (iVar1 == 0x8cd5) {
    (**(code **)(lVar3 + 0x1a00))(0,0,pixelFormat.alphaBits,pixelFormat.blueBits);
    tcu::RenderTarget::RenderTarget
              (&local_100,pixelFormat.alphaBits,pixelFormat.blueBits,(PixelFormat *)&stencilBits,
               local_44,local_48,config->numSamples);
    memcpy(&this->m_renderTarget,&local_100,0x24);
    tcu::RenderTarget::~RenderTarget(&local_100);
    return;
  }
  local_da = 1;
  pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Framebuffer is not complete",&local_d9);
  tcu::NotSupportedError::NotSupportedError(pNVar4,&local_d8);
  local_da = 0;
  __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void FboRenderContext::createFramebuffer (const RenderConfig& config)
{
	DE_ASSERT(m_framebuffer == 0 && m_colorBuffer == 0 && m_depthStencilBuffer == 0);

	const glw::Functions&	gl					= m_context->getFunctions();
	const deUint32			colorFormat			= chooseColorFormat(config);
	const deUint32			depthStencilFormat	= chooseDepthStencilFormat(config);
	int						width				= config.width;
	int						height				= config.height;
	tcu::PixelFormat		pixelFormat;
	int						depthBits			= 0;
	int						stencilBits			= 0;

	if (config.numSamples > 0 && !gl.renderbufferStorageMultisample)
		throw tcu::NotSupportedError("Multisample FBO is not supported");

	if (colorFormat == 0)
		throw tcu::NotSupportedError("Unsupported color attachment format");

	if (width == glu::RenderConfig::DONT_CARE || height == glu::RenderConfig::DONT_CARE)
	{
		int maxSize = 0;
		gl.getIntegerv(GL_MAX_RENDERBUFFER_SIZE, &maxSize);

		width	= (width	== glu::RenderConfig::DONT_CARE) ? maxSize : width;
		height	= (height	== glu::RenderConfig::DONT_CARE) ? maxSize : height;
	}

	{
		pixelFormat = getPixelFormat(colorFormat);

		gl.genRenderbuffers(1, &m_colorBuffer);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_colorBuffer);

		if (config.numSamples > 0)
			gl.renderbufferStorageMultisample(GL_RENDERBUFFER, config.numSamples, colorFormat, width, height);
		else
			gl.renderbufferStorage(GL_RENDERBUFFER, colorFormat, width, height);

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Creating color renderbuffer");
	}

	if (depthStencilFormat != GL_NONE)
	{
		getDepthStencilBits(depthStencilFormat, &depthBits, &stencilBits);

		gl.genRenderbuffers(1, &m_depthStencilBuffer);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_depthStencilBuffer);

		if (config.numSamples > 0)
			gl.renderbufferStorageMultisample(GL_RENDERBUFFER, config.numSamples, depthStencilFormat, width, height);
		else
			gl.renderbufferStorage(GL_RENDERBUFFER, depthStencilFormat, width, height);

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Creating depth / stencil renderbuffer");
	}

	gl.genFramebuffers(1, &m_framebuffer);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	if (m_colorBuffer)
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorBuffer);

	if (m_depthStencilBuffer)
	{
		if (depthBits > 0)
			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_depthStencilBuffer);

		if (stencilBits > 0)
			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_depthStencilBuffer);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Creating framebuffer");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::NotSupportedError("Framebuffer is not complete");

	// Set up correct viewport for first test case.
	gl.viewport(0, 0, width, height);

	m_renderTarget = tcu::RenderTarget(width, height, pixelFormat, depthBits, stencilBits, config.numSamples);
}